

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

void sptk::PrintErrorMessage(string *program_name,ostringstream *message)

{
  ostream *poVar1;
  string *in_RDI;
  ostringstream stream;
  string local_1d8 [32];
  string local_1b8 [48];
  ostringstream local_188 [384];
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,local_8);
  poVar1 = std::operator<<(poVar1,": ");
  std::__cxx11::ostringstream::str();
  poVar1 = std::operator<<(poVar1,local_1b8);
  poVar1 = std::operator<<(poVar1,"!");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::str();
  std::operator<<((ostream *)&std::cerr,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void PrintErrorMessage(const std::string& program_name,
                       const std::ostringstream& message) {
  std::ostringstream stream;
  stream << program_name << ": " << message.str() << "!" << std::endl;
  std::cerr << stream.str();
}